

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O0

int GPIO::GPIOBase::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined8 uVar4;
  GPIOError *this;
  AutoFile fd;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int mode;
  unsigned_long __len;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  AutoFile *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  char *in_stack_ffffffffffffff48;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  bool local_92;
  allocator<char> local_91;
  char local_90 [4];
  int in_stack_ffffffffffffff74;
  off_t in_stack_ffffffffffffff78;
  AutoFile *in_stack_ffffffffffffff80;
  allocator<char> local_69 [36];
  byte local_45;
  byte local_32;
  allocator<char> local_31 [37];
  AutoFile local_c [3];
  
  mode = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  iVar3 = 0x145cb0;
  if (peripherals_base == 0) {
    if (simulate) {
      peripherals_base = 0x20000000;
      peripherals_size = 0x1000000;
      std::make_unique<unsigned_long[]>((size_t)in_stack_ffffffffffffff28);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator=
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)
                 in_stack_ffffffffffffff10);
      peripherals = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
                              ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *
                               )in_stack_ffffffffffffff10);
    }
    else {
      Tools::AutoFile::AutoFile(local_c);
      local_32 = 0;
      local_45 = 0;
      local_92 = false;
      if ((want_full_mapping & 1U) == 0) {
        std::allocator<char>::allocator();
        local_32 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
        ;
        local_45 = 1;
        local_92 = Tools::AutoFile::open_nothrow
                             (in_stack_ffffffffffffff28,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),mode);
      }
      if ((local_45 & 1) != 0) {
        std::__cxx11::string::~string(in_stack_ffffffffffffff10);
      }
      if ((local_32 & 1) != 0) {
        std::allocator<char>::~allocator(local_31);
      }
      if (local_92 == false) {
        __s = local_69;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff50,(char *)__s,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40))
        ;
        bVar1 = Tools::AutoFile::open_nothrow
                          (in_stack_ffffffffffffff28,
                           (string *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           mode);
        bVar2 = bVar1 ^ 0xff;
        std::__cxx11::string::~string(in_stack_ffffffffffffff10);
        std::allocator<char>::~allocator(local_69);
        if ((bVar2 & 1) == 0) {
          Tools::AutoFile::seek
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
          Tools::AutoFile::read<unsigned_long>
                    ((AutoFile *)in_stack_ffffffffffffff10,
                     (unsigned_long *)in_stack_ffffffffffffff08);
          if (peripherals_base == 0) {
            Tools::AutoFile::read<unsigned_long>
                      ((AutoFile *)in_stack_ffffffffffffff10,
                       (unsigned_long *)in_stack_ffffffffffffff08);
          }
          iVar3 = 0x145cb8;
          Tools::AutoFile::read<unsigned_long>
                    ((AutoFile *)in_stack_ffffffffffffff10,
                     (unsigned_long *)in_stack_ffffffffffffff08);
          Tools::AutoFile::close(local_c,iVar3);
          Tools::byteswap<unsigned_long>
                    ((unsigned_long *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
          ;
          Tools::byteswap<unsigned_long>
                    ((unsigned_long *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
          ;
        }
        else {
          peripherals_base = 0x20000000;
          peripherals_size = 0x1000000;
        }
        if (peripherals_base == 0) {
          uVar4 = __cxa_allocate_exception(0x10);
          GPIOError::runtime_error
                    ((GPIOError *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
          __cxa_throw(uVar4,&GPIOError::typeinfo,GPIOError::~GPIOError);
        }
        if (peripherals_size == 0) {
          uVar4 = __cxa_allocate_exception(0x10);
          GPIOError::runtime_error
                    ((GPIOError *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
          __cxa_throw(uVar4,&GPIOError::typeinfo,GPIOError::~GPIOError);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff50,(char *)__s,
                   (allocator<char> *)CONCAT17(bVar2,in_stack_ffffffffffffff40));
        Tools::AutoFile::open(local_c,local_90,0x101002);
        std::__cxx11::string::~string(in_stack_ffffffffffffff10);
        std::allocator<char>::~allocator(&local_91);
        __len = peripherals_size;
        iVar3 = Tools::AutoFile::operator*((AutoFile *)0x12f1eb);
        peripherals = (unsigned_long *)mmap((void *)0x0,__len,3,1,iVar3,peripherals_base);
        if (peripherals == (unsigned_long *)0xffffffffffffffff) {
          this = (GPIOError *)__cxa_allocate_exception(0x10);
          GPIOError::runtime_error(this,(char *)in_stack_ffffffffffffff08);
          __cxa_throw(this,&GPIOError::typeinfo,GPIOError::~GPIOError);
        }
      }
      else {
        iVar3 = Tools::AutoFile::operator*((AutoFile *)0x12ee4a);
        gpio_addr = (unsigned_long *)mmap((void *)0x0,0x1000,3,1,iVar3,0);
        if (gpio_addr == (unsigned_long *)0xffffffffffffffff) {
          uVar4 = __cxa_allocate_exception(0x10);
          GPIOError::runtime_error
                    ((GPIOError *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
          __cxa_throw(uVar4,&GPIOError::typeinfo,GPIOError::~GPIOError);
        }
        gpio_only = true;
      }
      Tools::AutoFile::~AutoFile((AutoFile *)in_stack_ffffffffffffff10);
    }
    if ((gpio_only & 1U) == 0) {
      gpio_addr = peripherals + 0x40000;
      pwm_addr = peripherals + 0x41800;
      clk_addr = peripherals + 0x20200;
      pads_addr = peripherals + 0x20000;
      spi0_addr = peripherals + 0x40800;
      bsc0_addr = peripherals + 0x40a00;
      bsc1_addr = peripherals + 0x100800;
      st_addr = peripherals + 0x600;
    }
    else {
      peripherals = (unsigned_long *)0x0;
      pwm_addr = (unsigned_long *)0x0;
      clk_addr = (unsigned_long *)0x0;
      pads_addr = (unsigned_long *)0x0;
      spi0_addr = (unsigned_long *)0x0;
      bsc0_addr = (unsigned_long *)0x0;
      bsc1_addr = (unsigned_long *)0x0;
      st_addr = (unsigned_long *)0x0;
    }
    iVar3 = 0x145d10;
  }
  return iVar3;
}

Assistant:

void GPIOBase::init()
{
    if (!peripherals_base) {

#ifndef __linux
        // this GPIO is only existing in Linux type operating systems. When compiling e.g. on a Mac,
        // force simulation mode for debugging.

        simulate = true;
#endif

        // check if we are in simulation mode (probably on another hardware, like a PC or a Mac)

        if (simulate) {

            peripherals_base = 0x20000000;
            peripherals_size = 0x01000000;

            peripherals_sim = std::make_unique<unsigned long[]>(peripherals_size / 4);
            peripherals = peripherals_sim.get();

        } else {

            // use /dev/gpiomem if available (does not need root, only group gpio, but we lose access on
            // PWM and all other buses than gpio.
            // however - as all higher level protocols are well handled by Linux modules, this should not
            // be an issue. Only problem is the pwm clock frequency, which cannot be set through a kernel
            // module. See /boot/overlay/README.)

            Tools::AutoFile fd;

            if (!want_full_mapping && fd.open_nothrow("/dev/gpiomem", O_RDWR | O_SYNC)) {

                gpio_addr = static_cast<volatile unsigned long*>(::mmap(nullptr, GPIO_MEM_BLOCK_SIZE,
                                                                        (PROT_READ | PROT_WRITE),
                                                                        MAP_SHARED, *fd, 0));
                if (gpio_addr == MAP_FAILED) throw GPIOError("mmap failed on /dev/gpiomem");
                
                gpio_only = true;

            } else {

                // Try to determine peripherals_base and peripherals_size

                // The peripherals base address is announced in /proc/device-tree/soc/ranges with
                // an offset of 4 and a size of 4, followed by the size.

                // If the file does not exist it shall be assumed 0x20000000 and the size with 0x01000000
                // (which was the address on the raspi 1 versions)

                if (!fd.open_nothrow("/proc/device-tree/soc/ranges", O_RDONLY)) {

                    // this is apparently a raspi 1 with an old kernel

                    peripherals_base = 0x20000000;
                    peripherals_size = 0x01000000;

                } else {

                    // else read base address at pos 4
                    fd.seek(4, SEEK_SET);
                    fd.read(peripherals_base);

					if (peripherals_base == 0) {
						// on the raspberry pi 4 the base is at pos 8, not 4,
						// and the size is at pos 12, not 8
						// see https://github.com/raspberrypi/userland/blob/master/host_applications/linux/libs/bcm_host/bcm_host.c
						// in bcm_host_get_peripheral_address()
						fd.read(peripherals_base);
					}

                    fd.read(peripherals_size);

                    fd.close();

                    Tools::byteswap(peripherals_base);
                    Tools::byteswap(peripherals_size);

                }

                if (!peripherals_base) throw GPIOError("cannot read SOC peripherals base address");
                if (!peripherals_size) throw GPIOError("cannot read SOC peripherals size");

                fd.open("/dev/mem", O_RDWR | O_SYNC);

                peripherals = static_cast<volatile unsigned long*>(::mmap(nullptr, peripherals_size,
                                                                          (PROT_READ | PROT_WRITE),
                                                                          MAP_SHARED,
                                                                          *fd, peripherals_base));
                if (peripherals == MAP_FAILED) throw GPIOError("mmap failed on /dev/mem");

            }

        }

        if (gpio_only) {

            peripherals = nullptr;
            pwm_addr    = nullptr;
            clk_addr    = nullptr;
            pads_addr   = nullptr;
            spi0_addr   = nullptr;
            bsc0_addr   = nullptr;
            bsc1_addr   = nullptr;
            st_addr     = nullptr;

        } else {

            gpio_addr   = peripherals + GPIO_BASE  / sizeof(peripherals);
            pwm_addr    = peripherals + GPIO_PWM   / sizeof(peripherals);
            clk_addr    = peripherals + CLOCK_BASE / sizeof(peripherals);
            pads_addr   = peripherals + GPIO_PADS  / sizeof(peripherals);
            spi0_addr   = peripherals + SPI0_BASE  / sizeof(peripherals);
            bsc0_addr   = peripherals + BSC0_BASE  / sizeof(peripherals);
            bsc1_addr   = peripherals + BSC1_BASE  / sizeof(peripherals);
            st_addr     = peripherals + ST_BASE    / sizeof(peripherals);
            
        }
    }
}